

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

KernelSource * __thiscall xe::ri::List::allocItem<xe::ri::KernelSource>(List *this)

{
  size_type sVar1;
  KernelSource *this_00;
  KernelSource *local_30 [3];
  KernelSource *local_18;
  KernelSource *item;
  List *this_local;
  
  item = (KernelSource *)this;
  sVar1 = std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::size(&this->m_items);
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve(&this->m_items,sVar1 + 1);
  this_00 = (KernelSource *)operator_new(0x30);
  KernelSource::KernelSource(this_00);
  local_30[0] = this_00;
  local_18 = this_00;
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::push_back
            (&this->m_items,(value_type *)local_30);
  return local_18;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}